

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casDec.c
# Opt level: O0

void WriteLUTSintoBLIFfile
               (FILE *pFile,DdManager *dd,LUT **pLuts,int nLuts,DdNode **bCVars,char **pNames,
               int nNames,char *FileName)

{
  LUT *pLVar1;
  char *pcVar2;
  DdNode *n;
  DdNode *n_00;
  DdNode *n_01;
  LUT *p;
  DdNode *bFunc;
  DdNode *bCof;
  DdNode *bCube;
  uint local_40;
  int o;
  int v;
  int i;
  char **pNames_local;
  DdNode **bCVars_local;
  int nLuts_local;
  LUT **pLuts_local;
  DdManager *dd_local;
  FILE *pFile_local;
  
  o = 0;
  while( true ) {
    if (nLuts <= o) {
      return;
    }
    pLVar1 = pLuts[o];
    if ((o == nLuts + -1) && (pLVar1->nMulti != 1)) break;
    fprintf((FILE *)pFile,"#----------------- LUT #%d ----------------------\n",(ulong)(uint)o);
    if (o != 0) {
      for (local_40 = 0; (int)local_40 < pLVar1->nInsP; local_40 = local_40 + 1) {
        sprintf(WriteLUTSintoBLIFfile::Buffer,"LUT%02d_%02d",(ulong)(o - 1),(ulong)local_40);
        pcVar2 = Extra_UtilStrsav(WriteLUTSintoBLIFfile::Buffer);
        WriteLUTSintoBLIFfile::pNamesLocalIn[dd->invperm[(int)local_40]] = pcVar2;
      }
    }
    for (local_40 = 0; (int)local_40 < pLVar1->nIns - pLVar1->nInsP; local_40 = local_40 + 1) {
      pcVar2 = Extra_UtilStrsav(pNames[dd->invperm[(int)(pLVar1->Level + local_40)]]);
      WriteLUTSintoBLIFfile::pNamesLocalIn[dd->invperm[(int)(pLVar1->Level + local_40)]] = pcVar2;
    }
    for (local_40 = 0; (int)local_40 < pLVar1->nMulti; local_40 = local_40 + 1) {
      sprintf(WriteLUTSintoBLIFfile::Buffer,"LUT%02d_%02d",(ulong)(uint)o,(ulong)local_40);
      if (o == nLuts + -1) {
        pcVar2 = Extra_UtilStrsav("F");
        WriteLUTSintoBLIFfile::pNamesLocalOut[(int)local_40] = pcVar2;
      }
      else {
        pcVar2 = Extra_UtilStrsav(WriteLUTSintoBLIFfile::Buffer);
        WriteLUTSintoBLIFfile::pNamesLocalOut[(int)local_40] = pcVar2;
      }
    }
    sprintf(WriteLUTSintoBLIFfile::Buffer,"L%02d_",(ulong)(uint)o);
    n = Extra_bddBitsToCube(dd,(1 << ((byte)pLVar1->nMulti & 0x1f)) + -1,pLVar1->nMulti,bCVars,1);
    Cudd_Ref(n);
    for (bCube._4_4_ = 0; (int)bCube._4_4_ < pLVar1->nMulti; bCube._4_4_ = bCube._4_4_ + 1) {
      n_00 = Cudd_Cofactor(dd,pLVar1->bRelation,bCVars[(int)bCube._4_4_]);
      Cudd_Ref(n_00);
      n_01 = Cudd_bddExistAbstract(dd,n_00,n);
      Cudd_Ref(n_01);
      Cudd_RecursiveDeref(dd,n_00);
      sprintf(WriteLUTSintoBLIFfile::Buffer,"L%02d_%02d_",(ulong)(uint)o,(ulong)bCube._4_4_);
      WriteDDintoBLIFfile(pFile,n_01,WriteLUTSintoBLIFfile::pNamesLocalOut[(int)bCube._4_4_],
                          WriteLUTSintoBLIFfile::Buffer,WriteLUTSintoBLIFfile::pNamesLocalIn);
      Cudd_RecursiveDeref(dd,n_01);
    }
    Cudd_RecursiveDeref(dd,n);
    for (local_40 = 0; (int)local_40 < dd->size; local_40 = local_40 + 1) {
      if ((WriteLUTSintoBLIFfile::pNamesLocalIn[(int)local_40] != (char *)0x0) &&
         (WriteLUTSintoBLIFfile::pNamesLocalIn[(int)local_40] != (char *)0x0)) {
        free(WriteLUTSintoBLIFfile::pNamesLocalIn[(int)local_40]);
        WriteLUTSintoBLIFfile::pNamesLocalIn[(int)local_40] = (char *)0x0;
      }
      WriteLUTSintoBLIFfile::pNamesLocalIn[(int)local_40] = (char *)0x0;
    }
    for (local_40 = 0; (int)local_40 < pLVar1->nMulti; local_40 = local_40 + 1) {
      if (WriteLUTSintoBLIFfile::pNamesLocalOut[(int)local_40] != (char *)0x0) {
        free(WriteLUTSintoBLIFfile::pNamesLocalOut[(int)local_40]);
        WriteLUTSintoBLIFfile::pNamesLocalOut[(int)local_40] = (char *)0x0;
      }
    }
    o = o + 1;
  }
  __assert_fail("p->nMulti == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/cas/casDec.c"
                ,0x1b1,
                "void WriteLUTSintoBLIFfile(FILE *, DdManager *, LUT **, int, DdNode **, char **, int, char *)"
               );
}

Assistant:

void WriteLUTSintoBLIFfile( FILE * pFile, DdManager * dd, LUT ** pLuts, int nLuts, DdNode ** bCVars, char ** pNames, int nNames, char * FileName )
{
    int i, v, o;
    static char * pNamesLocalIn[MAXINPUTS];
    static char * pNamesLocalOut[MAXINPUTS];
    static char Buffer[100];
    DdNode * bCube, * bCof, * bFunc;
    LUT * p;

    // go through all the LUTs
    for ( i = 0; i < nLuts; i++ )
    {
        // get the pointer to the LUT
        p = pLuts[i];

        if ( i == nLuts -1 )
        {
            assert( p->nMulti == 1 );
        }


        fprintf( pFile, "#----------------- LUT #%d ----------------------\n", i );


        // fill in the names for the current LUT

        // write the outputs of the previous LUT
        if ( i != 0 )
        for ( v = 0; v < p->nInsP; v++ )
        {
            sprintf( Buffer, "LUT%02d_%02d", i-1, v );
            pNamesLocalIn[dd->invperm[v]] = Extra_UtilStrsav( Buffer );
        }
        // write the primary inputs of the current LUT
        for ( v = 0; v < p->nIns - p->nInsP; v++ )
            pNamesLocalIn[dd->invperm[p->Level+v]] = Extra_UtilStrsav( pNames[dd->invperm[p->Level+v]] );
        // write the outputs of the current LUT
        for ( v = 0; v < p->nMulti; v++ )
        {
            sprintf( Buffer, "LUT%02d_%02d", i, v );
            if ( i != nLuts - 1 )
                pNamesLocalOut[v] = Extra_UtilStrsav( Buffer );
            else 
                pNamesLocalOut[v] = Extra_UtilStrsav( "F" );
        }


        // write LUT outputs

        // get the prefix
        sprintf( Buffer, "L%02d_", i );

        // get the cube of encoding variables
        bCube = Extra_bddBitsToCube( dd, (1<<p->nMulti)-1, p->nMulti, bCVars, 1 );   Cudd_Ref( bCube );

        // write each output of the LUT
        for ( o = 0; o < p->nMulti; o++ )
        {
            // get the cofactor of this output
            bCof = Cudd_Cofactor( dd, p->bRelation, bCVars[o] );  Cudd_Ref( bCof );
            // quantify the remaining variables to get the function
            bFunc = Cudd_bddExistAbstract( dd, bCof, bCube );     Cudd_Ref( bFunc );
            Cudd_RecursiveDeref( dd, bCof );
            
            // write BLIF
            sprintf( Buffer, "L%02d_%02d_", i, o );

//          WriteDDintoBLIFfileReorder( dd, pFile, bFunc, pNamesLocalOut[o], Buffer, pNamesLocalIn );
            // does not work well; the advantage is marginal (30%), the run time is huge...

            WriteDDintoBLIFfile( pFile, bFunc, pNamesLocalOut[o], Buffer, pNamesLocalIn );
            Cudd_RecursiveDeref( dd, bFunc );
        }
        Cudd_RecursiveDeref( dd, bCube );

        // clean up the previous local names
        for ( v = 0; v < dd->size; v++ )
        {
            if ( pNamesLocalIn[v] )
                ABC_FREE( pNamesLocalIn[v] );
            pNamesLocalIn[v] = NULL;
        }
        for ( v = 0; v < p->nMulti; v++ )
            ABC_FREE( pNamesLocalOut[v] );
    }
}